

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,float kappa,float delta,float theta)

{
  int k;
  bool bVar1;
  int selected;
  long lVar2;
  bool bVar3;
  rc_size sizes;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  rc_size local_50;
  _Head_base<0UL,_int_*,_false> local_48;
  row_iterator local_40;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_38;
  
  bVar3 = false;
  local_38._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl =
       (tuple<int_*,_std::default_delete<int[]>_>)
       (tuple<int_*,_std::default_delete<int[]>_>)last._M_current;
  for (; (tuple<int_*,_std::default_delete<int[]>_>)first._M_current !=
         (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
         local_38._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
         super__Head_base<0UL,_int_*,_false>._M_head_impl; first._M_current = first._M_current + 8)
  {
    k = (first._M_current)->first;
    sparse_matrix<int>::row((sparse_matrix<int> *)&local_48,(int)this + 0x10);
    solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>
    ::decrease_preference
              ((solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                *)this,local_40,(row_iterator)local_48._M_head_impl,theta);
    local_50 = solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>
               ::compute_reduced_costs<baryonyx::bit_array>
                         ((solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                           *)this,local_40,(row_iterator)local_48._M_head_impl,x);
    calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>::rc_data*>
              (*(rc_data **)(this + 0x68),*(rc_data **)(this + 0x68) + local_50.r_size,
               *(random_engine **)(this + 8));
    lVar2 = (long)k * 0xc;
    selected = solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>
               ::select_variables((solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                                   *)this,&local_50,*(int *)(*(long *)(this + 0x70) + lVar2),
                                  *(int *)(*(long *)(this + 0x70) + 4 + lVar2));
    bVar1 = affect<baryonyx::itm::solver_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,float>
                      ((solver_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_false>
                        *)this,x,local_40,k,selected,local_50.r_size,kappa,delta);
    bVar3 = (bool)(bVar3 | bVar1);
  }
  return bVar3;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].min, b[k].max);

            logger::log("constraints {}: {} <= ", k, b[k].min);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({} {}) ", R[i].f, R[i].value, R[i].id);

            logger::log("<= {} => Selected: {}\n", b[k].max, selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }